

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void add_csc_range_penalty<PredictionData<float,unsigned_long>>
               (WorkerForPredictCSC *workspace,PredictionData<float,_unsigned_long> *prediction_data
               ,double *weights_arr,size_t col_num,double range_low,double range_high)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  ulong uVar5;
  float *pfVar6;
  pointer pdVar7;
  unsigned_long uVar8;
  long lVar9;
  ulong uVar10;
  ulong *puVar11;
  pointer puVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  ulong *puVar18;
  size_t row;
  ulong uVar19;
  double dVar20;
  
  puVar12 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar4 = puVar12 + workspace->st;
  puVar12 = puVar12 + workspace->end + 1;
  if (puVar4 != puVar12) {
    uVar10 = (long)puVar12 - (long)puVar4 >> 3;
    lVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar12,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar12);
  }
  puVar2 = prediction_data->Xc_ind;
  uVar17 = prediction_data->Xc_indptr[col_num];
  uVar3 = prediction_data->Xc_indptr[col_num + 1];
  puVar4 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = workspace->st;
  puVar11 = puVar4 + uVar10;
  uVar5 = workspace->end;
  puVar13 = puVar4 + uVar5 + 1;
  uVar14 = (long)puVar13 - (long)puVar11 >> 3;
  if (0 < (long)uVar14) {
    do {
      uVar15 = uVar14 >> 1;
      uVar16 = ~uVar15 + uVar14;
      uVar14 = uVar15;
      if (puVar11[uVar15] < puVar2[uVar17]) {
        puVar11 = puVar11 + uVar15 + 1;
        uVar14 = uVar16;
      }
    } while (0 < (long)uVar14);
  }
  uVar14 = puVar2[uVar3 - 1];
  if ((0.0 < range_low) || (range_high < 0.0)) {
    if (weights_arr == (double *)0x0) {
      if (uVar10 <= uVar5) {
        pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pdVar7[puVar4[uVar10]] = pdVar7[puVar4[uVar10]] + -1.0;
          uVar10 = uVar10 + 1;
        } while (uVar10 <= uVar5);
      }
    }
    else if (uVar10 <= uVar5) {
      pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar8 = puVar4[uVar10];
        pdVar7[uVar8] = pdVar7[uVar8] - weights_arr[uVar8];
        uVar10 = uVar10 + 1;
      } while (uVar10 <= uVar5);
    }
    if (uVar17 != uVar3 && puVar11 != puVar13) {
      pfVar6 = prediction_data->Xc;
      pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (uVar10 = *puVar11, uVar10 <= uVar14) {
        puVar1 = puVar2 + uVar17;
        uVar15 = *puVar1;
        if (uVar15 == uVar10) {
          if ((NAN(pfVar6[uVar17])) ||
             ((dVar20 = (double)pfVar6[uVar17], range_low <= dVar20 && (dVar20 <= range_high)))) {
            dVar20 = 1.0;
            if (weights_arr != (double *)0x0) {
              dVar20 = weights_arr[uVar10];
            }
            pdVar7[uVar10] = dVar20 + pdVar7[uVar10];
          }
          if (puVar11 == puVar4 + uVar5) {
            return;
          }
          if (uVar17 == uVar3 - 1) {
            return;
          }
          puVar18 = puVar1 + 1;
          puVar11 = puVar11 + 1;
          uVar10 = (long)((long)puVar2 + (uVar3 * 8 - (long)puVar18)) >> 3;
          if (0 < (long)uVar10) {
            do {
              uVar15 = uVar10 >> 1;
              uVar16 = ~uVar15 + uVar10;
              uVar10 = uVar15;
              if (puVar18[uVar15] < *puVar11) {
                puVar18 = puVar18 + uVar15 + 1;
                uVar10 = uVar16;
              }
            } while (0 < (long)uVar10);
          }
LAB_0030e8ca:
          uVar17 = (long)puVar18 - (long)puVar2 >> 3;
        }
        else {
          if (uVar15 <= uVar10) {
            puVar18 = puVar1 + 1;
            uVar15 = (long)((long)puVar2 + (uVar3 * 8 - (long)(puVar1 + 1))) >> 3;
            while (0 < (long)uVar15) {
              uVar16 = uVar15 >> 1;
              uVar19 = ~uVar16 + uVar15;
              uVar15 = uVar16;
              if (puVar18[uVar16] < uVar10) {
                puVar18 = puVar18 + uVar16 + 1;
                uVar15 = uVar19;
              }
            }
            goto LAB_0030e8ca;
          }
          puVar11 = puVar11 + 1;
          uVar10 = (long)puVar13 - (long)puVar11 >> 3;
          while (0 < (long)uVar10) {
            uVar16 = uVar10 >> 1;
            uVar19 = ~uVar16 + uVar10;
            uVar10 = uVar16;
            if (puVar11[uVar16] < uVar15) {
              puVar11 = puVar11 + uVar16 + 1;
              uVar10 = uVar19;
            }
          }
        }
        if (puVar11 == puVar13) {
          return;
        }
        if (uVar17 == uVar3) {
          return;
        }
      }
    }
  }
  else if (uVar17 != uVar3 && puVar11 != puVar13) {
    pfVar6 = prediction_data->Xc;
    pdVar7 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (uVar10 = *puVar11, uVar10 <= uVar14) {
      puVar1 = puVar2 + uVar17;
      uVar15 = *puVar1;
      if (uVar15 == uVar10) {
        if ((!NAN(pfVar6[uVar17])) &&
           ((dVar20 = (double)pfVar6[uVar17], dVar20 < range_low || (range_high < dVar20)))) {
          dVar20 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar20 = weights_arr[uVar10];
          }
          pdVar7[uVar10] = pdVar7[uVar10] - dVar20;
        }
        if (puVar11 == puVar4 + uVar5) {
          return;
        }
        if (uVar17 == uVar3 - 1) {
          return;
        }
        puVar18 = puVar1 + 1;
        puVar11 = puVar11 + 1;
        uVar10 = (long)((long)puVar2 + (uVar3 * 8 - (long)puVar18)) >> 3;
        if (0 < (long)uVar10) {
          do {
            uVar16 = uVar10 >> 1;
            uVar15 = ~uVar16 + uVar10;
            uVar10 = uVar16;
            if (puVar18[uVar16] < *puVar11) {
              puVar18 = puVar18 + uVar16 + 1;
              uVar10 = uVar15;
            }
          } while (0 < (long)uVar10);
        }
LAB_0030e718:
        uVar17 = (long)puVar18 - (long)puVar2 >> 3;
      }
      else {
        if (uVar15 <= uVar10) {
          puVar18 = puVar1 + 1;
          uVar15 = (long)((long)puVar2 + (uVar3 * 8 - (long)(puVar1 + 1))) >> 3;
          while (0 < (long)uVar15) {
            uVar19 = uVar15 >> 1;
            uVar16 = ~uVar19 + uVar15;
            uVar15 = uVar19;
            if (puVar18[uVar19] < uVar10) {
              puVar18 = puVar18 + uVar19 + 1;
              uVar15 = uVar16;
            }
          }
          goto LAB_0030e718;
        }
        puVar11 = puVar11 + 1;
        uVar10 = (long)puVar13 - (long)puVar11 >> 3;
        while (0 < (long)uVar10) {
          uVar16 = uVar10 >> 1;
          uVar19 = ~uVar16 + uVar10;
          uVar10 = uVar16;
          if (puVar11[uVar16] < uVar15) {
            puVar11 = puVar11 + uVar16 + 1;
            uVar10 = uVar19;
          }
        }
      }
      if (puVar11 == puVar13) {
        return;
      }
      if (uVar17 == uVar3) {
        return;
      }
    }
  }
  return;
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}